

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DPIImportSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DPIImportSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::FunctionPrototypeSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,Token *args_5,
          FunctionPrototypeSyntax *args_6,Token *args_7)

{
  Info *pIVar1;
  Info *pIVar2;
  size_t sVar3;
  pointer ppAVar4;
  Info *pIVar5;
  Info *pIVar6;
  Info *pIVar7;
  Info *pIVar8;
  SyntaxNode *pSVar9;
  undefined4 uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  TokenKind TVar15;
  undefined1 uVar16;
  NumericTokenFlags NVar17;
  uint32_t uVar18;
  TokenKind TVar19;
  undefined1 uVar20;
  NumericTokenFlags NVar21;
  uint32_t uVar22;
  TokenKind TVar23;
  undefined1 uVar24;
  NumericTokenFlags NVar25;
  uint32_t uVar26;
  TokenKind TVar27;
  undefined1 uVar28;
  NumericTokenFlags NVar29;
  uint32_t uVar30;
  TokenKind TVar31;
  undefined1 uVar32;
  NumericTokenFlags NVar33;
  uint32_t uVar34;
  DPIImportSyntax *pDVar35;
  long lVar36;
  
  pDVar35 = (DPIImportSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DPIImportSyntax *)this->endPtr < pDVar35 + 1) {
    pDVar35 = (DPIImportSyntax *)allocateSlow(this,0xb8,8);
  }
  else {
    this->head->current = (byte *)(pDVar35 + 1);
  }
  TVar11 = args_1->kind;
  uVar12 = args_1->field_0x2;
  NVar13.raw = (args_1->numFlags).raw;
  uVar14 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar15 = args_2->kind;
  uVar16 = args_2->field_0x2;
  NVar17.raw = (args_2->numFlags).raw;
  uVar18 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar19 = args_3->kind;
  uVar20 = args_3->field_0x2;
  NVar21.raw = (args_3->numFlags).raw;
  uVar22 = args_3->rawLen;
  pIVar5 = args_3->info;
  TVar23 = args_4->kind;
  uVar24 = args_4->field_0x2;
  NVar25.raw = (args_4->numFlags).raw;
  uVar26 = args_4->rawLen;
  pIVar6 = args_4->info;
  TVar27 = args_5->kind;
  uVar28 = args_5->field_0x2;
  NVar29.raw = (args_5->numFlags).raw;
  uVar30 = args_5->rawLen;
  pIVar7 = args_5->info;
  TVar31 = args_7->kind;
  uVar32 = args_7->field_0x2;
  NVar33.raw = (args_7->numFlags).raw;
  uVar34 = args_7->rawLen;
  pIVar8 = args_7->info;
  (pDVar35->super_MemberSyntax).super_SyntaxNode.kind = DPIImport;
  (pDVar35->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pDVar35->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar10 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar9 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pDVar35->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(pDVar35->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       uVar10;
  (pDVar35->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar9;
  (pDVar35->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pDVar35->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00698df0;
  (pDVar35->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar3 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pDVar35->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_ptr;
  (pDVar35->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar3;
  (pDVar35->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00698d40;
  (pDVar35->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pDVar35;
  sVar3 = (pDVar35->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar3 != 0) {
    ppAVar4 = (pDVar35->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar36 = 0;
    do {
      *(DPIImportSyntax **)(*(long *)((long)ppAVar4 + lVar36) + 8) = pDVar35;
      lVar36 = lVar36 + 8;
    } while (sVar3 << 3 != lVar36);
  }
  (pDVar35->keyword).kind = TVar11;
  (pDVar35->keyword).field_0x2 = uVar12;
  (pDVar35->keyword).numFlags = (NumericTokenFlags)NVar13.raw;
  (pDVar35->keyword).rawLen = uVar14;
  (pDVar35->keyword).info = pIVar1;
  (pDVar35->specString).kind = TVar15;
  (pDVar35->specString).field_0x2 = uVar16;
  (pDVar35->specString).numFlags = (NumericTokenFlags)NVar17.raw;
  (pDVar35->specString).rawLen = uVar18;
  (pDVar35->specString).info = pIVar2;
  (pDVar35->property).kind = TVar19;
  (pDVar35->property).field_0x2 = uVar20;
  (pDVar35->property).numFlags = (NumericTokenFlags)NVar21.raw;
  (pDVar35->property).rawLen = uVar22;
  (pDVar35->property).info = pIVar5;
  (pDVar35->c_identifier).kind = TVar23;
  (pDVar35->c_identifier).field_0x2 = uVar24;
  (pDVar35->c_identifier).numFlags = (NumericTokenFlags)NVar25.raw;
  (pDVar35->c_identifier).rawLen = uVar26;
  (pDVar35->c_identifier).info = pIVar6;
  (pDVar35->equals).kind = TVar27;
  (pDVar35->equals).field_0x2 = uVar28;
  (pDVar35->equals).numFlags = (NumericTokenFlags)NVar29.raw;
  (pDVar35->equals).rawLen = uVar30;
  (pDVar35->equals).info = pIVar7;
  (pDVar35->method).ptr = args_6;
  (pDVar35->semi).kind = TVar31;
  (pDVar35->semi).field_0x2 = uVar32;
  (pDVar35->semi).numFlags = (NumericTokenFlags)NVar33.raw;
  (pDVar35->semi).rawLen = uVar34;
  (pDVar35->semi).info = pIVar8;
  (args_6->super_SyntaxNode).parent = (SyntaxNode *)pDVar35;
  return pDVar35;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }